

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O0

EVP_PKEY * EVP_PKEY_new_raw_private_key(int type,ENGINE *unused,uint8_t *in,size_t len)

{
  _func_int_EVP_PKEY_ptr_uint8_t_ptr_size_t *p_Var1;
  bool bVar2;
  int iVar3;
  EVP_PKEY *__p;
  pointer peVar4;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> ret;
  EVP_PKEY_ASN1_METHOD *method;
  size_t len_local;
  uint8_t *in_local;
  ENGINE *unused_local;
  pointer peStack_10;
  int type_local;
  
  if (type == 0x3b4) {
    ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)&x25519_asn1_meth;
  }
  else {
    if (type != 0x3b5) {
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                    ,0xf7);
      return (EVP_PKEY *)0x0;
    }
    ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)&ed25519_asn1_meth;
  }
  __p = EVP_PKEY_new();
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_40,(pointer)__p);
  bVar2 = std::operator==(&local_40,(nullptr_t)0x0);
  if (bVar2) {
    peStack_10 = (pointer)0x0;
  }
  else {
    peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
    evp_pkey_set_method(peVar4,(EVP_PKEY_ASN1_METHOD *)
                               ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator->(&local_40);
    p_Var1 = peVar4->ameth->set_priv_raw;
    peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
    iVar3 = (*p_Var1)(peVar4,in,len);
    if (iVar3 == 0) {
      peStack_10 = (pointer)0x0;
    }
    else {
      peStack_10 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::release(&local_40);
    }
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  return peStack_10;
}

Assistant:

EVP_PKEY *EVP_PKEY_new_raw_private_key(int type, ENGINE *unused,
                                       const uint8_t *in, size_t len) {
  // To avoid pulling in all key types, look for specifically the key types that
  // support |set_priv_raw|.
  const EVP_PKEY_ASN1_METHOD *method;
  switch (type) {
    case EVP_PKEY_X25519:
      method = &x25519_asn1_meth;
      break;
    case EVP_PKEY_ED25519:
      method = &ed25519_asn1_meth;
      break;
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
      return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  if (!ret->ameth->set_priv_raw(ret.get(), in, len)) {
    return nullptr;
  }

  return ret.release();
}